

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  long in_RDI;
  float border_y;
  int y_2;
  int y_1;
  ImU32 outer_col;
  ImRect outer_border;
  int y;
  float draw_y2;
  ImU32 col;
  bool is_frozen_separator;
  bool is_resizable;
  bool is_resized;
  bool is_hovered;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float draw_y2_head;
  float draw_y2_body;
  float draw_y1;
  float border_size;
  ImDrawList *inner_drawlist;
  ImGuiWindow *inner_window;
  ImDrawList *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  ImU32 in_stack_fffffffffffffef4;
  ImDrawList *in_stack_fffffffffffffef8;
  ImDrawList *pos;
  ImDrawList *in_stack_ffffffffffffff00;
  ImVec2 in_stack_ffffffffffffff08;
  ImVec2 in_stack_ffffffffffffff10;
  ImU32 local_e0;
  float local_dc;
  ImU32 local_d8;
  ImU32 local_d4;
  bool local_ce;
  bool local_cd;
  float local_cc;
  float local_c8;
  ImVec2 local_9c;
  ImVec2 local_94;
  int local_8c;
  ImVec2 local_88;
  ImVec2 local_80;
  int local_78;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 local_68;
  ImVec2 local_60;
  int local_58;
  float local_54;
  ImU32 local_50;
  bool local_4c;
  undefined1 local_4b;
  bool local_4a;
  undefined1 local_49;
  ImGuiTableColumn *local_48;
  int local_40;
  int local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  ImDrawList *local_18;
  long local_10;
  long local_8;
  
  local_10 = *(long *)(in_RDI + 0x1d0);
  local_8 = in_RDI;
  bVar2 = ImRect::Overlaps((ImRect *)(*(long *)(in_RDI + 0x1c8) + 600),(ImRect *)(in_RDI + 0xec));
  if (bVar2) {
    local_18 = *(ImDrawList **)(local_10 + 0x2b8);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef4);
    local_20 = *(undefined8 *)(local_8 + 0x13c);
    local_28 = *(undefined8 *)(local_8 + 0x144);
    ImDrawList::PushClipRect
              (in_stack_ffffffffffffff00,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
    local_2c = 0x3f800000;
    local_cc = *(float *)(local_8 + 0x100);
    local_34 = *(float *)(local_8 + 0x108);
    local_30 = local_cc;
    if ((*(byte *)(local_8 + 0x24c) & 1) != 0) {
      if (*(char *)(local_8 + 0x241) < '\x01') {
        local_c8 = *(float *)(local_8 + 0x110);
      }
      else {
        local_c8 = *(float *)(local_8 + 0x100);
      }
      local_cc = ImMin<float>(*(float *)(local_8 + 0x108),local_c8 + *(float *)(local_8 + 0xd0));
    }
    local_38 = local_cc;
    if ((*(uint *)(local_8 + 4) & 0x200) != 0) {
      for (local_3c = 0; local_3c < *(int *)(local_8 + 0x6c); local_3c = local_3c + 1) {
        if ((*(ulong *)(local_8 + 0x40) & 1L << ((byte)local_3c & 0x3f)) != 0) {
          pcVar3 = ImSpan<signed_char>::operator[]((ImSpan<signed_char> *)(local_8 + 0x20),local_3c)
          ;
          local_40 = (int)*pcVar3;
          local_48 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)(local_8 + 0x10),local_40);
          local_49 = *(char *)(local_8 + 0x235) == local_40;
          local_cd = false;
          if (*(char *)(local_8 + 0x237) == local_40) {
            local_cd = *(short *)(local_8 + 0x7a) == *(short *)(local_8 + 0x78);
          }
          local_4a = local_cd;
          local_4b = (local_48->Flags & 0x40000010U) == 0;
          local_ce = false;
          if (*(char *)(local_8 + 0x243) != -1) {
            local_ce = (int)*(char *)(local_8 + 0x243) == local_3c + 1;
          }
          local_4c = local_ce;
          if ((((local_48->MaxX < *(float *)(local_8 + 0x124) ||
                 local_48->MaxX == *(float *)(local_8 + 0x124)) || (local_cd != false)) &&
              (((local_48->NextEnabledColumn != -1 || ((bool)local_4b)) ||
               (((*(uint *)(local_8 + 4) & 0xe000) == 0x4000 &&
                ((*(uint *)(local_8 + 4) & 0x10000) == 0)))))) &&
             ((local_48->ClipRect).Min.x < local_48->MaxX)) {
            if ((((bool)local_49) || (local_cd != false)) || (local_ce != false)) {
              local_54 = local_34;
              if (local_cd == false) {
                if ((bool)local_49) {
                  local_d8 = GetColorU32(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
                }
                else {
                  local_d8 = *(ImU32 *)(local_8 + 0xa0);
                }
                local_d4 = local_d8;
              }
              else {
                local_d4 = GetColorU32(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
              }
              local_50 = local_d4;
            }
            else {
              if ((*(uint *)(local_8 + 4) & 0x1800) == 0) {
                local_dc = local_34;
              }
              else {
                local_dc = local_38;
              }
              local_54 = local_dc;
              if ((*(uint *)(local_8 + 4) & 0x1800) == 0) {
                local_e0 = *(ImU32 *)(local_8 + 0xa4);
              }
              else {
                local_e0 = *(ImU32 *)(local_8 + 0xa0);
              }
              local_50 = local_e0;
            }
            if (local_30 < local_54) {
              for (local_58 = (int)local_30; (float)local_58 < local_54; local_58 = local_58 + 1) {
                ImVec2::ImVec2(&local_60,local_48->MaxX - 0.1,(float)local_58);
                ImDrawList::AddText(in_stack_ffffffffffffff00,(ImVec2 *)in_stack_fffffffffffffef8,
                                    in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
                                    (char *)in_stack_fffffffffffffee0);
              }
            }
          }
        }
      }
    }
    uVar1 = local_70;
    if ((*(uint *)(local_8 + 4) & 0x500) != 0) {
      uVar1 = *(undefined8 *)(local_8 + 0xec);
      local_68 = *(undefined8 *)(local_8 + 0xf4);
      local_74 = *(undefined4 *)(local_8 + 0xa0);
      local_70._4_4_ = (float)((ulong)uVar1 >> 0x20);
      local_70 = uVar1;
      if ((*(uint *)(local_8 + 4) & 0x500) == 0x500) {
        for (local_78 = (int)local_70._4_4_; uVar1 = local_70, (float)local_78 < local_68._4_4_;
            local_78 = local_78 + 1) {
          ImVec2::ImVec2(&local_80,(float)local_70,(float)local_78);
          ImDrawList::AddText(in_stack_ffffffffffffff00,(ImVec2 *)in_stack_fffffffffffffef8,
                              in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
                              (char *)in_stack_fffffffffffffee0);
          ImVec2::ImVec2(&local_88,(float)local_68 - 2.0,(float)local_78);
          ImDrawList::AddText(in_stack_ffffffffffffff00,(ImVec2 *)in_stack_fffffffffffffef8,
                              in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
                              (char *)in_stack_fffffffffffffee0);
        }
      }
      else if ((*(uint *)(local_8 + 4) & 0x400) != 0) {
        for (local_8c = (int)local_70._4_4_; uVar1 = local_70, (float)local_8c < local_68._4_4_;
            local_8c = local_8c + 1) {
          pos = local_18;
          ImVec2::ImVec2(&local_94,(float)local_70,(float)local_8c);
          ImDrawList::AddText(in_stack_ffffffffffffff00,(ImVec2 *)pos,in_stack_fffffffffffffef4,
                              in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
          in_stack_ffffffffffffff00 = local_18;
          ImVec2::ImVec2(&local_9c,(float)local_68 - 2.0,(float)local_8c);
          ImDrawList::AddText(in_stack_ffffffffffffff00,(ImVec2 *)pos,in_stack_fffffffffffffef4,
                              in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
        }
      }
    }
    local_70 = uVar1;
    ImDrawList::PopClipRect(in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter.SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1) {
                //inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2 - 1.0f), col, 0.1f);
                for (int y = draw_y1; y < draw_y2; ++y) {
                    inner_drawlist->AddText(ImVec2(column->MaxX - 0.1f, y), col, "|");
                }
            }
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            for (int y = outer_border.Min.y; y < outer_border.Max.y; ++y) {
                inner_drawlist->AddText(ImVec2(outer_border.Min.x, y), outer_col, "|");
                inner_drawlist->AddText(ImVec2(outer_border.Max.x - 2.0f, y), outer_col, "|");
            }
            //inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            for (int y = outer_border.Min.y; y < outer_border.Max.y; ++y) {
                inner_drawlist->AddText(ImVec2(outer_border.Min.x, y), outer_col, "|");
                inner_drawlist->AddText(ImVec2(outer_border.Max.x - 2.0f, y), outer_col, "|");
            }
            //inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            //inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH && false)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y && false)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}